

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool __thiscall llvm::ItaniumPartialDemangler::hasFunctionQualifiers(ItaniumPartialDemangler *this)

{
  FunctionEncoding *this_00;
  bool bVar1;
  FunctionRefQual FVar2;
  Qualifiers QVar3;
  bool local_31;
  FunctionEncoding *E;
  ItaniumPartialDemangler *this_local;
  
  if (this->RootNode == (void *)0x0) {
    __assert_fail("RootNode != nullptr && \"must call partialDemangle()\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                  ,0x1432,"bool llvm::ItaniumPartialDemangler::hasFunctionQualifiers() const");
  }
  bVar1 = isFunction(this);
  if (bVar1) {
    this_00 = (FunctionEncoding *)this->RootNode;
    QVar3 = anon_unknown.dwarf_426d84::FunctionEncoding::getCVQuals(this_00);
    local_31 = true;
    if (QVar3 == QualNone) {
      FVar2 = anon_unknown.dwarf_426d84::FunctionEncoding::getRefQual(this_00);
      local_31 = FVar2 != FrefQualNone;
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ItaniumPartialDemangler::hasFunctionQualifiers() const {
  assert(RootNode != nullptr && "must call partialDemangle()");
  if (!isFunction())
    return false;
  auto *E = static_cast<FunctionEncoding *>(RootNode);
  return E->getCVQuals() != QualNone || E->getRefQual() != FrefQualNone;
}